

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
::next_raw(optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,
          Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
          *this,bool all_cofacets)

{
  simplex_t sVar1;
  Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_> *this_00;
  bool bVar2;
  vertex_t n;
  coefficient_t cVar3;
  reference this_01;
  float *pfVar4;
  simplex_t sVar5;
  diameter_entry_t dVar6;
  int local_6c;
  diameter_entry_t local_40;
  uint local_30;
  uint local_2c;
  coefficient_t cofacet_coefficient;
  coefficient_t modulus;
  simplex_t cofacet_index;
  float local_18;
  undefined1 local_11;
  value_t cofacet_diameter;
  bool all_cofacets_local;
  Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
  *this_local;
  
  local_11 = all_cofacets;
  _cofacet_diameter = this;
  bVar2 = has_next(this,all_cofacets);
  if (bVar2) {
    this_01 = std::
              vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
              ::operator[](&this->neighbor_it,0);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
    ::operator++(this_01);
    cofacet_index._4_4_ = ripser::get_diameter(&this->simplex);
    cofacet_index._0_4_ = ripser::get_diameter(&this->neighbor);
    pfVar4 = std::max<float>((float *)((long)&cofacet_index + 4),(float *)&cofacet_index);
    local_18 = *pfVar4;
    sVar1 = this->idx_above;
    this_00 = this->simplex_encoding;
    n = get_vertex(&this->neighbor);
    sVar5 = Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::operator()
                      (this_00,n,this->k + '\x01');
    _cofacet_coefficient = sVar1 + sVar5 + this->idx_below;
    local_2c = this->parent->modulus;
    if ((this->k & 1U) == 0) {
      local_6c = 1;
    }
    else {
      local_6c = local_2c - 1;
    }
    cVar3 = Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
            ::get_coefficient(this->parent,&this->simplex);
    local_30 = (local_6c * cVar3) % local_2c;
    dVar6 = Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
            ::make_diameter_entry(this->parent,local_18,_cofacet_coefficient,local_30);
    local_40.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
    .second = dVar6.
              super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
              .second.index;
    local_40.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
    .first = dVar6.
             super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
             .first;
    std::
    optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
    ::
    optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t,_true>
              (__return_storage_ptr__,&local_40);
  }
  else {
    std::
    optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>
    ::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<diameter_entry_t> next_raw(bool all_cofacets = true) {
      if (!has_next(all_cofacets)) return std::nullopt;
      ++neighbor_it[0];
      value_t cofacet_diameter = std::max(get_diameter(simplex), get_diameter(neighbor));
      simplex_t cofacet_index = idx_above + simplex_encoding(get_vertex(neighbor), k + 1) + idx_below;
      const coefficient_t modulus = parent.modulus;
      coefficient_t cofacet_coefficient =
        (k & 1 ? modulus - 1 : 1) * parent.get_coefficient(simplex) % modulus;
      return parent.make_diameter_entry(cofacet_diameter, cofacet_index, cofacet_coefficient);
    }